

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O1

void __thiscall boost::uuids::detail::sha1::get_digest(sha1 *this,digest_type *digest)

{
  uchar uVar1;
  size_t sVar2;
  ulong uVar3;
  
  sVar2 = this->block_byte_index_;
  this->block_byte_index_ = sVar2 + 1;
  this->block_[sVar2] = 0x80;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  uVar3 = this->block_byte_index_;
  if (uVar3 < 0x39) {
    if (uVar3 != 0x38) {
      do {
        this->block_byte_index_ = uVar3 + 1;
        this->block_[uVar3] = '\0';
        if (uVar3 + 1 == 0x40) {
          this->block_byte_index_ = 0;
          process_block(this);
        }
        uVar3 = this->block_byte_index_;
      } while (uVar3 < 0x38);
    }
  }
  else {
    do {
      this->block_byte_index_ = uVar3 + 1;
      this->block_[uVar3] = '\0';
      if (this->block_byte_index_ == 0x40) {
        this->block_byte_index_ = 0;
        process_block(this);
      }
      uVar3 = this->block_byte_index_;
    } while (uVar3 != 0);
    uVar3 = this->block_byte_index_;
    while (uVar3 < 0x38) {
      this->block_byte_index_ = uVar3 + 1;
      this->block_[uVar3] = '\0';
      if (uVar3 + 1 == 0x40) {
        this->block_byte_index_ = 0;
        process_block(this);
      }
      uVar3 = this->block_byte_index_;
    }
  }
  uVar1 = *(uchar *)((long)&this->bit_count_high + 3);
  sVar2 = this->block_byte_index_;
  this->block_byte_index_ = sVar2 + 1;
  this->block_[sVar2] = uVar1;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  uVar1 = *(uchar *)((long)&this->bit_count_high + 2);
  sVar2 = this->block_byte_index_;
  this->block_byte_index_ = sVar2 + 1;
  this->block_[sVar2] = uVar1;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  uVar1 = *(uchar *)((long)&this->bit_count_high + 1);
  sVar2 = this->block_byte_index_;
  this->block_byte_index_ = sVar2 + 1;
  this->block_[sVar2] = uVar1;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  sVar2 = this->block_byte_index_;
  this->block_byte_index_ = sVar2 + 1;
  this->block_[sVar2] = (uchar)this->bit_count_high;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  uVar1 = *(uchar *)((long)&this->bit_count_low + 3);
  sVar2 = this->block_byte_index_;
  this->block_byte_index_ = sVar2 + 1;
  this->block_[sVar2] = uVar1;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  uVar1 = *(uchar *)((long)&this->bit_count_low + 2);
  sVar2 = this->block_byte_index_;
  this->block_byte_index_ = sVar2 + 1;
  this->block_[sVar2] = uVar1;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  uVar1 = *(uchar *)((long)&this->bit_count_low + 1);
  sVar2 = this->block_byte_index_;
  this->block_byte_index_ = sVar2 + 1;
  this->block_[sVar2] = uVar1;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  sVar2 = this->block_byte_index_;
  this->block_byte_index_ = sVar2 + 1;
  this->block_[sVar2] = (uchar)this->bit_count_low;
  if (this->block_byte_index_ == 0x40) {
    this->block_byte_index_ = 0;
    process_block(this);
  }
  (*digest)[0] = this->h_[0];
  (*digest)[1] = this->h_[1];
  (*digest)[2] = this->h_[2];
  (*digest)[3] = this->h_[3];
  (*digest)[4] = this->h_[4];
  return;
}

Assistant:

inline void sha1::get_digest(digest_type& digest)
{
    // append the bit '1' to the message
    process_byte_impl(0x80);

    // append k bits '0', where k is the minimum number >= 0
    // such that the resulting message length is congruent to 56 (mod 64)
    // check if there is enough space for padding and bit_count
    if (block_byte_index_ > 56) {
        // finish this block
        while (block_byte_index_ != 0) {
            process_byte_impl(0);
        }

        // one more block
        while (block_byte_index_ < 56) {
            process_byte_impl(0);
        }
    } else {
        while (block_byte_index_ < 56) {
            process_byte_impl(0);
        }
    }

    // append length of message (before pre-processing)
    // as a 64-bit big-endian integer
    process_byte_impl( static_cast<unsigned char>((bit_count_high>>24) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_high>>16) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_high>>8 ) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_high)     & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low>>24) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low>>16) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low>>8 ) & 0xFF) );
    process_byte_impl( static_cast<unsigned char>((bit_count_low)     & 0xFF) );

    // get final digest
    digest[0] = h_[0];
    digest[1] = h_[1];
    digest[2] = h_[2];
    digest[3] = h_[3];
    digest[4] = h_[4];
}